

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::SetShafts
          (Underwater_Acoustic_PDU *this,
          vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_> *S)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_> *S_local;
  Underwater_Acoustic_PDU *this_local;
  
  sVar1 = std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::size
                    (&this->m_vShafts);
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength - (short)(sVar1 << 3);
  std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::operator=
            (&this->m_vShafts,S);
  sVar1 = std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::size
                    (&this->m_vShafts);
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + (short)(sVar1 << 3);
  sVar1 = std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::size
                    (&this->m_vShafts);
  this->m_ui8NumShafts = (KUINT8)sVar1;
  return;
}

Assistant:

void Underwater_Acoustic_PDU::SetShafts( const vector<Shaft> & S )
{
    // Reset PDU length
    m_ui16PDULength -= m_vShafts.size() * Shaft::SHAFT_SIZE;

    m_vShafts = S;

    // Calculate the new PDU length
    m_ui16PDULength += m_vShafts.size() * Shaft::SHAFT_SIZE;

    m_ui8NumShafts = m_vShafts.size();
}